

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_output_init_alloc
              (uint64_t satoshi,uchar *script,size_t script_len,wally_tx_output **output)

{
  int iVar1;
  wally_tx_output *output_00;
  int iVar2;
  
  if (output == (wally_tx_output **)0x0) {
    iVar2 = -2;
  }
  else {
    *output = (wally_tx_output *)0x0;
    output_00 = (wally_tx_output *)wally_calloc(0x70);
    *output = output_00;
    if (output_00 == (wally_tx_output *)0x0) {
      iVar2 = -3;
    }
    else {
      iVar1 = tx_elements_output_init
                        (satoshi,script,script_len,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                         (uchar *)0x0,0,(uchar *)0x0,0,output_00,false);
      iVar2 = 0;
      if (iVar1 != 0) {
        clear_and_free(output_00,0x70);
        *output = (wally_tx_output *)0x0;
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int wally_tx_output_init_alloc(uint64_t satoshi,
                               const unsigned char *script, size_t script_len,
                               struct wally_tx_output **output)
{
    struct wally_tx_output *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_output);

    ret = wally_tx_output_init(satoshi, script, script_len, result);

    if (ret != WALLY_OK) {
        clear_and_free(result, sizeof(*result));
        *output = NULL;
    }
    return ret;
}